

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (size <= uVar4) {
      return 1;
    }
    while (0x1fff < ply->buffer_last) {
      ply->buffer_last = 0;
      sVar3 = fwrite(ply->buffer,1,0x2000,(FILE *)ply->fp);
      uVar2 = (uint)(sVar3 >= 0x2000);
      if (sVar3 < 0x2000) {
        return uVar2;
      }
      if (size <= uVar4) {
        return uVar2;
      }
    }
    pcVar1 = (char *)((long)anybuffer + uVar4);
    uVar4 = uVar4 + 1;
    ply->buffer[ply->buffer_last] = *pcVar1;
    ply->buffer_last = ply->buffer_last + 1;
  } while( true );
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *)anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}